

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiArea::removeSubWindow(QMdiArea *this,QWidget *widget)

{
  QMdiAreaPrivate *this_00;
  QPointer<QMdiSubWindow> *pQVar1;
  long lVar2;
  Data *pDVar3;
  bool bVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  QMdiSubWindow *child;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_58;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    removeSubWindow();
  }
  else {
    this_00 = *(QMdiAreaPrivate **)
               &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    if ((this_00->childWindows).d.size != 0) {
      pQVar5 = (QWidget *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
      if (pQVar5 == (QWidget *)0x0) {
        local_58.d = (this_00->childWindows).d.d;
        pQVar1 = (this_00->childWindows).d.ptr;
        local_58.size = (this_00->childWindows).d.size;
        if (local_58.d != (Data *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.ptr = pQVar1;
        if (local_58.size != 0) {
          lVar7 = local_58.size * 0x10;
          lVar9 = 0;
          do {
            lVar2 = *(long *)((long)&(pQVar1->wp).d + lVar9);
            if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
              child = (QMdiSubWindow *)0x0;
            }
            else {
              child = *(QMdiSubWindow **)((long)&(pQVar1->wp).value + lVar9);
            }
            bVar4 = sanityCheck(child,"QMdiArea::removeSubWindow");
            if (bVar4) {
              pQVar5 = QMdiSubWindow::widget(child);
              if (pQVar5 == widget) {
                QMdiSubWindow::setWidget(child,(QWidget *)0x0);
                goto LAB_004427b4;
              }
            }
            lVar9 = lVar9 + 0x10;
          } while (lVar7 != lVar9);
        }
        removeSubWindow();
LAB_004427b4:
        QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_58);
      }
      else {
        lVar9 = (this_00->childWindows).d.size;
        if (lVar9 != 0) {
          pQVar1 = (this_00->childWindows).d.ptr;
          iVar8 = 1;
          lVar7 = 0;
          do {
            if (lVar9 << 4 == lVar7) goto LAB_004427db;
            lVar2 = *(long *)((long)&(pQVar1->wp).d + lVar7);
            if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
              pQVar6 = (QWidget *)0x0;
            }
            else {
              pQVar6 = *(QWidget **)((long)&(pQVar1->wp).value + lVar7);
            }
            lVar7 = lVar7 + 0x10;
            iVar8 = iVar8 + -1;
          } while (pQVar6 != pQVar5);
          if (iVar8 != 1) {
            QMdiAreaPrivate::disconnectSubWindow(this_00,(QObject *)pQVar5);
            local_58.d = (Data *)&local_40;
            local_40 = pQVar5;
            QtPrivate::
            sequential_erase_if<QList<QPointer<QMdiSubWindow>>,QtPrivate::sequential_erase<QList<QPointer<QMdiSubWindow>>,QMdiSubWindow*>(QList<QPointer<QMdiSubWindow>>&,QMdiSubWindow*const&)::_lambda(auto:1_const&)_1_>
                      (&this_00->childWindows,(anon_class_8_1_54a39814_for__M_pred *)&local_58);
            local_40 = (QWidget *)CONCAT44(local_40._4_4_,-iVar8);
            local_58.d = (Data *)&local_40;
            QtPrivate::
            sequential_erase_if<QList<int>,QtPrivate::sequential_erase<QList<int>,int>(QList<int>&,int_const&)::_lambda(auto:1_const&)_1_>
                      (&this_00->indicesToActivatedChildren,
                       (anon_class_8_1_54a39814_for__M_pred_conflict *)&local_58);
            pDVar3 = (this_00->active).wp.d;
            if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
              pQVar6 = (QWidget *)0x0;
            }
            else {
              pQVar6 = (QWidget *)(this_00->active).wp.value;
            }
            QMdiAreaPrivate::updateActiveWindow(this_00,-iVar8,pQVar6 == pQVar5);
            QWidget::setParent(pQVar5,(QWidget *)0x0);
            goto LAB_004427bc;
          }
        }
LAB_004427db:
        removeSubWindow();
      }
    }
  }
LAB_004427bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::removeSubWindow(QWidget *widget)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QMdiArea::removeSubWindow: null pointer to widget");
        return;
    }

    Q_D(QMdiArea);
    if (d->childWindows.isEmpty())
        return;

    if (QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(widget)) {
        int index = d->childWindows.indexOf(child);
        if (Q_UNLIKELY(index == -1)) {
            qWarning("QMdiArea::removeSubWindow: window is not inside workspace");
            return;
        }
        d->disconnectSubWindow(child);
        d->childWindows.removeAll(child);
        d->indicesToActivatedChildren.removeAll(index);
        d->updateActiveWindow(index, d->active == child);
        child->setParent(nullptr);
        return;
    }

    bool found = false;
    // Take a copy because child->setWidget(nullptr) will indirectly
    // QCoreApplication::sendEvent(); the latter could call unknown code that could
    // e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::removeSubWindow"))
            continue;
        if (child->widget() == widget) {
            child->setWidget(nullptr);
            Q_ASSERT(!child->widget());
            found = true;
            break;
        }
    }

    if (Q_UNLIKELY(!found))
        qWarning("QMdiArea::removeSubWindow: widget is not child of any window inside QMdiArea");
}